

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O2

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::compute_split_estimate
          (clusterizer<crnlib::vec<2U,_float>_> *this,vec<2U,_float> *left_child_res,
          vec<2U,_float> *right_child_res,vq_node *parent_node)

{
  float fVar1;
  ulong uVar2;
  uint i;
  ulong uVar3;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar4;
  uint i_1;
  float fVar5;
  vec<2U,_float> local_60;
  vec<2U,_float> *local_58;
  vec<2U,_float> *local_50;
  vec<2U,_float> local_48;
  vec<2U,_float> local_40;
  vec<2U,_float> local_38;
  
  local_60.m_s[0] = 0.0;
  local_60.m_s[1] = 0.0;
  fVar1 = -1.0;
  local_58 = left_child_res;
  local_50 = right_child_res;
  for (uVar3 = 0; uVar2 = (ulong)(parent_node->m_vectors).m_size, uVar3 < uVar2; uVar3 = uVar3 + 1)
  {
    ppVar4 = (this->m_training_vecs).m_p + (parent_node->m_vectors).m_p[uVar3];
    fVar5 = vec<2U,_float>::squared_distance(&ppVar4->first,&parent_node->m_centroid);
    if (fVar1 < fVar5) {
      vec<2U,_float>::operator=(&local_60,&ppVar4->first);
      fVar1 = fVar5;
    }
  }
  local_48.m_s[0] = 0.0;
  local_48.m_s[1] = 0.0;
  fVar1 = -1.0;
  for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
    ppVar4 = (this->m_training_vecs).m_p + (parent_node->m_vectors).m_p[uVar3];
    fVar5 = vec<2U,_float>::squared_distance(&ppVar4->first,&local_60);
    if (fVar1 < fVar5) {
      vec<2U,_float>::operator=(&local_48,&ppVar4->first);
      fVar1 = fVar5;
    }
    uVar2 = (ulong)(parent_node->m_vectors).m_size;
  }
  operator+(&local_60,&parent_node->m_centroid);
  operator*(&local_40,0.5);
  vec<2U,_float>::operator=(local_58,&local_38);
  operator+(&local_48,&parent_node->m_centroid);
  operator*(&local_40,0.5);
  vec<2U,_float>::operator=(local_50,&local_38);
  return;
}

Assistant:

void compute_split_estimate(VectorType& left_child_res, VectorType& right_child_res, const vq_node& parent_node)
        {
            VectorType furthest(0);
            double furthest_dist = -1.0f;

            for (uint i = 0; i < parent_node.m_vectors.size(); i++)
            {
                const VectorType& v = m_training_vecs[parent_node.m_vectors[i]].first;

                double dist = v.squared_distance(parent_node.m_centroid);
                if (dist > furthest_dist)
                {
                    furthest_dist = dist;
                    furthest = v;
                }
            }

            VectorType opposite(0);
            double opposite_dist = -1.0f;

            for (uint i = 0; i < parent_node.m_vectors.size(); i++)
            {
                const VectorType& v = m_training_vecs[parent_node.m_vectors[i]].first;

                double dist = v.squared_distance(furthest);
                if (dist > opposite_dist)
                {
                    opposite_dist = dist;
                    opposite = v;
                }
            }

            left_child_res = (furthest + parent_node.m_centroid) * .5f;
            right_child_res = (opposite + parent_node.m_centroid) * .5f;
        }